

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  
  pIVar1 = GImGui->NavWindow;
  if (pIVar1 != (ImGuiWindow *)0x0) {
    if ((flags & 4U) != 0) {
      return true;
    }
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2 == (ImGuiWindow *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ca6,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
    }
    if ((flags & 2U) != 0) {
      pIVar2 = pIVar2->RootWindow;
      if ((flags & 8U) == 0) {
        pIVar2 = pIVar2->RootWindowPopupTree;
      }
      if ((flags & 0x10U) != 0) {
        pIVar2 = pIVar2->RootWindowDockTree;
      }
    }
    if ((flags & 1U) == 0) {
      return pIVar1 == pIVar2;
    }
    pIVar3 = pIVar1->RootWindow;
    if ((flags & 8U) == 0) {
      pIVar3 = pIVar3->RootWindowPopupTree;
    }
    if ((flags & 0x10U) != 0) {
      pIVar3 = pIVar3->RootWindowDockTree;
    }
    if (pIVar3 == pIVar2) {
      return true;
    }
    do {
      bVar4 = pIVar1 == pIVar2;
      if (bVar4) {
        return bVar4;
      }
      if (pIVar1 == pIVar3) {
        return bVar4;
      }
      pIVar1 = pIVar1->ParentWindow;
    } while (pIVar1 != (ImGuiWindow *)0x0);
  }
  return false;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    const bool dock_hierarchy = (flags & ImGuiFocusedFlags_DockHierarchy) != 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
    else
        return (ref_window == cur_window);
}